

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::addTypeHandlerImpl::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,HandlerBase **existing,HandlerBase *replacement)

{
  bool bVar1;
  Fault local_58;
  Fault f;
  undefined1 local_48 [8];
  DebugComparison<capnp::JsonCodec::HandlerBase_*&,_capnp::JsonCodec::HandlerBase_*&> _kjCondition;
  HandlerBase *replacement_local;
  HandlerBase **existing_local;
  anon_class_1_0_00000001 *this_local;
  
  _kjCondition._32_8_ = replacement;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,existing);
  kj::_::DebugExpression<capnp::JsonCodec::HandlerBase*&>::operator==
            ((DebugComparison<capnp::JsonCodec::HandlerBase_*&,_capnp::JsonCodec::HandlerBase_*&> *)
             local_48,(DebugExpression<capnp::JsonCodec::HandlerBase*&> *)&f,
             (HandlerBase **)&_kjCondition.result);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::JsonCodec::HandlerBase*&,capnp::JsonCodec::HandlerBase*&>&,char_const(&)[48]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x37e,FAILED,"existing == replacement",
               "_kjCondition,\"type already has a different registered handler\"",
               (DebugComparison<capnp::JsonCodec::HandlerBase_*&,_capnp::JsonCodec::HandlerBase_*&>
                *)local_48,(char (*) [48])"type already has a different registered handler");
    kj::_::Debug::Fault::fatal(&local_58);
  }
  return;
}

Assistant:

void JsonCodec::addTypeHandlerImpl(Type type, HandlerBase& handler) {
  impl->typeHandlers.upsert(type, &handler, [](HandlerBase*& existing, HandlerBase* replacement) {
    KJ_REQUIRE(existing == replacement, "type already has a different registered handler");
  });
}